

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu383.c
# Opt level: O2

MPP_RET hal_h265d_vdpu383_deinit(void *hal)

{
  long lVar1;
  MppBuffer buffer;
  void *ptr;
  long lVar2;
  
  if (*(MppBuffer *)((long)hal + 0x1c8) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu383_deinit");
    *(undefined8 *)((long)hal + 0x1c8) = 0;
  }
  lVar1 = (ulong)(*(int *)((long)hal + 0x180) != 0) * 2 + 1;
  for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    buffer = *(MppBuffer *)((long)hal + lVar2 * 8 + 0xe8);
    if (buffer != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(buffer,"hal_h265d_vdpu383_deinit");
      *(undefined8 *)((long)hal + lVar2 * 8 + 0xe8) = 0;
    }
  }
  if (*(MppBufferGroup *)((long)hal + 0x30) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x30));
    *(undefined8 *)((long)hal + 0x30) = 0;
  }
  for (lVar2 = 0; lVar1 * 0x28 - lVar2 != 0; lVar2 = lVar2 + 0x28) {
    ptr = *(void **)((long)hal + lVar2 + 0x128);
    if (ptr != (void *)0x0) {
      mpp_osal_free("hal_h265d_vdpu383_deinit",ptr);
    }
    *(undefined8 *)((long)hal + lVar2 + 0x128) = 0;
  }
  if (*(void **)((long)hal + 0x1a0) != (void *)0x0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x1a0));
  }
  *(undefined8 *)((long)hal + 0x1a0) = 0;
  if (*(void **)((long)hal + 0x198) != (void *)0x0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x198));
  }
  *(undefined8 *)((long)hal + 0x198) = 0;
  if (*(void **)((long)hal + 0x208) != (void *)0x0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x208));
  }
  *(undefined8 *)((long)hal + 0x208) = 0;
  if (*(void **)((long)hal + 0x210) != (void *)0x0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x210));
  }
  *(undefined8 *)((long)hal + 0x210) = 0;
  if (*(HalBufs *)((long)hal + 0x1a8) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x1a8));
    *(undefined8 *)((long)hal + 0x1a8) = 0;
  }
  if (*(HalBufs *)((long)hal + 0x218) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x218));
    *(undefined8 *)((long)hal + 0x218) = 0;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265d_vdpu383_deinit(void *hal)
{
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_U32 loop = reg_ctx->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->g_buf) : 1;
    RK_U32 i;

    if (reg_ctx->bufs) {
        mpp_buffer_put(reg_ctx->bufs);
        reg_ctx->bufs = NULL;
    }

    loop = reg_ctx->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->rcb_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }
    }

    if (reg_ctx->group) {
        mpp_buffer_group_put(reg_ctx->group);
        reg_ctx->group = NULL;
    }

    for (i = 0; i < loop; i++)
        MPP_FREE(reg_ctx->g_buf[i].hw_regs);

    MPP_FREE(reg_ctx->scaling_qm);
    MPP_FREE(reg_ctx->scaling_rk);
    MPP_FREE(reg_ctx->pps_buf);
    MPP_FREE(reg_ctx->sw_rps_buf);

    if (reg_ctx->cmv_bufs) {
        hal_bufs_deinit(reg_ctx->cmv_bufs);
        reg_ctx->cmv_bufs = NULL;
    }

    if (reg_ctx->origin_bufs) {
        hal_bufs_deinit(reg_ctx->origin_bufs);
        reg_ctx->origin_bufs = NULL;
    }

    return MPP_OK;
}